

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsOptions.h
# Opt level: O1

HighsOptions * __thiscall HighsOptions::operator=(HighsOptions *this,HighsOptions *other)

{
  if (other != this) {
    if ((int)((ulong)((long)(this->records).
                            super__Vector_base<OptionRecord_*,_std::allocator<OptionRecord_*>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->records).
                           super__Vector_base<OptionRecord_*,_std::allocator<OptionRecord_*>_>.
                           _M_impl.super__Vector_impl_data._M_start) >> 3) == 0) {
      initRecords(this);
    }
    HighsOptionsStruct::operator=(&this->super_HighsOptionsStruct,&other->super_HighsOptionsStruct);
    (this->super_HighsOptionsStruct).log_options.log_stream =
         (other->super_HighsOptionsStruct).log_options.log_stream;
    setLogOptions(this);
  }
  return this;
}

Assistant:

const HighsOptions& operator=(const HighsOptions& other) {
    if (&other != this) {
      if ((HighsInt)records.size() == 0) initRecords();
      HighsOptionsStruct::operator=(other);
      this->log_options.log_stream = other.log_options.log_stream;
      setLogOptions();
    }
    return *this;
  }